

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config_cmd.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  abuf_init(&log_buf);
  cfg_add(&instance);
  BEGIN_TESTING(clear_elements);
  test_cmd_sections();
  test_cmd_namedsections();
  test_cmd_entries();
  abuf_free(&log_buf);
  cfg_db_remove(db);
  cfg_remove(&instance);
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int
main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  abuf_init(&log_buf);

  cfg_add(&instance);

  BEGIN_TESTING(clear_elements);

  test_cmd_sections();
  test_cmd_namedsections();
  test_cmd_entries();

  abuf_free(&log_buf);
  cfg_db_remove(db);
  cfg_remove(&instance);

  return FINISH_TESTING();
}